

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodeframe.c
# Opt level: O0

void sb_qp_sweep_init_quantizers
               (AV1_COMP *cpi,ThreadData_conflict *td,TileDataEnc *tile_data,
               SIMPLE_MOTION_DATA_TREE *sms_tree,RD_STATS *rd_cost,int mi_row,int mi_col,
               int delta_qp_ofs)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  MACROBLOCK *x_00;
  long in_RSI;
  MACROBLOCK *in_RDI;
  RD_STATS *in_R8;
  int in_R9D;
  AV1_COMP *unaff_retaddr;
  int in_stack_00000008;
  int lf_id;
  int grid_idx;
  int k;
  int j;
  int mib_size;
  int frame_lf_count;
  int8_t delta_lf;
  int delta_lf_from_base;
  int lfmask;
  int delta_lf_res;
  MACROBLOCKD *xd;
  int current_qindex;
  int use_simple_motion_search;
  SPEED_FEATURES *sf;
  int delta_q_res;
  DeltaQInfo *delta_q_info;
  CommonModeInfoParams *mi_params;
  TileInfo *tile_info;
  BLOCK_SIZE sb_size;
  MACROBLOCK *x;
  AV1_COMMON *cm;
  int in_stack_000004b8;
  int in_stack_000004bc;
  SIMPLE_MOTION_DATA_TREE *in_stack_000004c0;
  MACROBLOCK *in_stack_000004c8;
  TileInfo *in_stack_000004d0;
  AV1_COMP *in_stack_000004d8;
  int local_c0;
  int local_b8;
  int in_stack_ffffffffffffff4c;
  int in_stack_ffffffffffffff50;
  uint in_stack_ffffffffffffff54;
  int local_a8;
  int local_a0;
  int local_9c;
  undefined4 in_stack_ffffffffffffff74;
  BLOCK_SIZE bsize;
  int in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff7c;
  AV1_COMP *cpi_00;
  long lVar6;
  MACROBLOCK *pMVar7;
  
  bsize = (BLOCK_SIZE)((uint)in_stack_ffffffffffffff74 >> 0x18);
  cpi_00 = (AV1_COMP *)(in_RDI[2].sb_enc.tpl_mv + 0x2e);
  lVar6 = in_RSI;
  pMVar7 = in_RDI;
  if ((((in_RDI[2].sb_enc.tpl_mv[0x35][5].as_int != 0) ||
       (in_RDI[2].sb_enc.tpl_mv[0x35][4].as_int != 0)) ||
      (in_RDI[2].sb_enc.tpl_mv[0x35][6].as_int != 0)) ||
     (in_stack_ffffffffffffff54 = in_stack_ffffffffffffff54 & 0xffffff,
     in_RDI[2].sb_enc.tpl_mv[0x33][5].as_int != 0)) {
    iVar1 = frame_is_intra_only((AV1_COMMON *)(in_RDI[1].picked_ref_frames_mask + 0x1b4));
    in_stack_ffffffffffffff54 = CONCAT13(iVar1 != 0,(int3)in_stack_ffffffffffffff54) ^ 0xff000000;
  }
  uVar2 = (uint)((byte)(in_stack_ffffffffffffff54 >> 0x18) & 1);
  if (uVar2 != 0) {
    av1_init_simple_motion_search_mvs_for_sb
              (in_stack_000004d8,in_stack_000004d0,in_stack_000004c8,in_stack_000004c0,
               in_stack_000004bc,in_stack_000004b8);
  }
  x_00 = (MACROBLOCK *)(in_RSI + 0x1a0);
  iVar1 = av1_adjust_q_from_delta_q_res
                    (in_stack_ffffffffffffff54,in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c);
  *(int *)(in_RSI + 0x420c) = iVar1 - in_RDI[1].picked_ref_frames_mask[0x24e];
  av1_set_offsets(cpi_00,(TileInfo *)CONCAT44(uVar2,iVar1),x_00,in_stack_ffffffffffffff7c,
                  in_stack_ffffffffffffff78,bsize);
  *(int *)(*(long *)(x_00->e_mbd).plane[2].seg_qmatrix[5][8] + 4) = iVar1;
  av1_init_plane_quantizers(unaff_retaddr,pMVar7,(int)((ulong)lVar6 >> 0x20),(int)lVar6);
  *(uint *)(lVar6 + 0x25d54) = (uint)(*(int *)(in_RSI + 0x420c) != 0) | *(uint *)(lVar6 + 0x25d54);
  if ((pMVar7[1].comp_rd_stats[0xb].model_dist[3] & 1) != 0) {
    iVar1 = *(int *)&in_RDI[1].comp_rd_stats[2].interinter_comp.field_0xc;
    iVar1 = clamp(*(int *)(in_RSI + 0x420c) / 4 + iVar1 / 2 & (iVar1 - 1U ^ 0xffffffff),-0x3f,0x3f);
    iVar3 = av1_num_planes((AV1_COMMON *)(in_RDI[1].picked_ref_frames_mask + 0x1b4));
    iVar4 = 2;
    if (1 < iVar3) {
      iVar4 = 4;
    }
    iVar3 = *(int *)(*(long *)(in_RDI[1].comp_rd_stats[4].is_global + 1) + 0x20);
    local_9c = 0;
    while( true ) {
      local_b8 = iVar3;
      if (in_RDI[1].picked_ref_frames_mask[0x239] - in_R9D <= iVar3) {
        local_b8 = in_RDI[1].picked_ref_frames_mask[0x239] - in_R9D;
      }
      if (local_b8 <= local_9c) break;
      local_a0 = 0;
      while( true ) {
        local_c0 = iVar3;
        if (in_RDI[1].picked_ref_frames_mask[0x23a] - in_stack_00000008 <= iVar3) {
          local_c0 = in_RDI[1].picked_ref_frames_mask[0x23a] - in_stack_00000008;
        }
        if (local_c0 <= local_a0) break;
        iVar5 = get_mi_grid_idx((CommonModeInfoParams *)(in_RDI[1].picked_ref_frames_mask + 0x236),
                                in_R9D + local_9c,in_stack_00000008 + local_a0);
        *(char *)(*(long *)(in_RDI[1].picked_ref_frames_mask + 0x23c) + (long)iVar5 * 0xb0 + 0xa2) =
             (char)iVar1;
        for (local_a8 = 0; local_a8 < iVar4; local_a8 = local_a8 + 1) {
          *(char *)(*(long *)(in_RDI[1].picked_ref_frames_mask + 0x23c) + (long)iVar5 * 0xb0 + 0xa3
                   + (long)local_a8) = (char)iVar1;
        }
        local_a0 = local_a0 + 1;
      }
      local_9c = local_9c + 1;
    }
  }
  *(undefined1 *)(in_RSI + 0x1f6c2) = 0;
  *(undefined4 *)(in_RSI + 0x24dfc) = 0;
  reset_mb_rd_record(*(MB_RD_RECORD **)(in_RSI + 0x25610));
  memset((void *)(in_RSI + 0x16200),0,0x1000);
  av1_invalid_rd_stats(in_R8);
  return;
}

Assistant:

static void sb_qp_sweep_init_quantizers(AV1_COMP *cpi, ThreadData *td,
                                        const TileDataEnc *tile_data,
                                        SIMPLE_MOTION_DATA_TREE *sms_tree,
                                        RD_STATS *rd_cost, int mi_row,
                                        int mi_col, int delta_qp_ofs) {
  AV1_COMMON *const cm = &cpi->common;
  MACROBLOCK *const x = &td->mb;
  const BLOCK_SIZE sb_size = cm->seq_params->sb_size;
  const TileInfo *tile_info = &tile_data->tile_info;
  const CommonModeInfoParams *const mi_params = &cm->mi_params;
  const DeltaQInfo *const delta_q_info = &cm->delta_q_info;
  assert(delta_q_info->delta_q_present_flag);
  const int delta_q_res = delta_q_info->delta_q_res;

  const SPEED_FEATURES *sf = &cpi->sf;
  const int use_simple_motion_search =
      (sf->part_sf.simple_motion_search_split ||
       sf->part_sf.simple_motion_search_prune_rect ||
       sf->part_sf.simple_motion_search_early_term_none ||
       sf->part_sf.ml_early_term_after_part_split_level) &&
      !frame_is_intra_only(cm);
  if (use_simple_motion_search) {
    av1_init_simple_motion_search_mvs_for_sb(cpi, tile_info, x, sms_tree,
                                             mi_row, mi_col);
  }

  int current_qindex = x->rdmult_cur_qindex + delta_qp_ofs;

  MACROBLOCKD *const xd = &x->e_mbd;
  current_qindex = av1_adjust_q_from_delta_q_res(
      delta_q_res, xd->current_base_qindex, current_qindex);

  x->delta_qindex = current_qindex - cm->quant_params.base_qindex;

  av1_set_offsets(cpi, tile_info, x, mi_row, mi_col, sb_size);
  xd->mi[0]->current_qindex = current_qindex;
  av1_init_plane_quantizers(cpi, x, xd->mi[0]->segment_id, 0);

  // keep track of any non-zero delta-q used
  td->deltaq_used |= (x->delta_qindex != 0);

  if (cpi->oxcf.tool_cfg.enable_deltalf_mode) {
    const int delta_lf_res = delta_q_info->delta_lf_res;
    const int lfmask = ~(delta_lf_res - 1);
    const int delta_lf_from_base =
        ((x->delta_qindex / 4 + delta_lf_res / 2) & lfmask);
    const int8_t delta_lf =
        (int8_t)clamp(delta_lf_from_base, -MAX_LOOP_FILTER, MAX_LOOP_FILTER);
    const int frame_lf_count =
        av1_num_planes(cm) > 1 ? FRAME_LF_COUNT : FRAME_LF_COUNT - 2;
    const int mib_size = cm->seq_params->mib_size;

    // pre-set the delta lf for loop filter. Note that this value is set
    // before mi is assigned for each block in current superblock
    for (int j = 0; j < AOMMIN(mib_size, mi_params->mi_rows - mi_row); j++) {
      for (int k = 0; k < AOMMIN(mib_size, mi_params->mi_cols - mi_col); k++) {
        const int grid_idx = get_mi_grid_idx(mi_params, mi_row + j, mi_col + k);
        mi_params->mi_alloc[grid_idx].delta_lf_from_base = delta_lf;
        for (int lf_id = 0; lf_id < frame_lf_count; ++lf_id) {
          mi_params->mi_alloc[grid_idx].delta_lf[lf_id] = delta_lf;
        }
      }
    }
  }

  x->reuse_inter_pred = false;
  x->txfm_search_params.mode_eval_type = DEFAULT_EVAL;
  reset_mb_rd_record(x->txfm_search_info.mb_rd_record);
  av1_zero(x->picked_ref_frames_mask);
  av1_invalid_rd_stats(rd_cost);
}